

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O3

int run_test_condvar_4(void)

{
  uv_mutex_t *puVar1;
  short sVar2;
  int iVar3;
  undefined8 uVar4;
  short *psVar5;
  ulong uVar6;
  code **ppcVar7;
  bool bVar8;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t thread;
  worker_config_conflict wc;
  code *apcStack_4a8 [2];
  undefined8 uStack_498;
  code *pcStack_490;
  long lStack_480;
  long lStack_478;
  undefined8 auStack_470 [4];
  undefined1 auStack_450 [16];
  long alStack_440 [13];
  undefined8 auStack_3d8 [13];
  long alStack_370 [27];
  undefined1 auStack_298 [216];
  uv_mutex_t *puStack_1c0;
  worker_config_conflict wStack_198;
  worker_config_conflict *pwStack_e0;
  undefined8 local_d8;
  long local_d0;
  undefined1 local_c8 [8];
  worker_config_conflict local_c0;
  
  pwStack_e0 = (worker_config_conflict *)0x183d7a;
  worker_config_init(&local_c0,1,condvar_signal,condvar_timedwait);
  pwStack_e0 = (worker_config_conflict *)0x183d8e;
  iVar3 = uv_thread_create(local_c8,worker,&local_c0);
  local_d0 = (long)iVar3;
  local_d8 = 0;
  if (local_d0 == 0) {
    pwStack_e0 = (worker_config_conflict *)0x183dbb;
    (*local_c0.wait_cond)(&local_c0,&local_c0.posted_1);
    pwStack_e0 = (worker_config_conflict *)0x183dc9;
    (*local_c0.signal_cond)(&local_c0,&local_c0.posted_2);
    pwStack_e0 = (worker_config_conflict *)0x183dd3;
    iVar3 = uv_thread_join(local_c8);
    local_d0 = (long)iVar3;
    local_d8 = 0;
    if (local_d0 == 0) {
      pwStack_e0 = (worker_config_conflict *)0x183df7;
      worker_config_destroy(&local_c0);
      return 0;
    }
  }
  else {
    pwStack_e0 = (worker_config_conflict *)0x183e0f;
    run_test_condvar_4_cold_1();
  }
  pwStack_e0 = (worker_config_conflict *)run_test_condvar_5;
  run_test_condvar_4_cold_2();
  pwStack_e0 = &local_c0;
  worker_config_init(&wStack_198,0,(signal_func)0x0,(wait_func)0x0);
  puVar1 = &wStack_198.mutex;
  uv_mutex_lock(puVar1);
  iVar3 = uv_cond_timedwait(&wStack_198.cond,puVar1,100000000);
  if (iVar3 == -0x6e) {
    uv_mutex_unlock(puVar1);
    worker_config_destroy(&wStack_198);
    return 0;
  }
  run_test_condvar_5_cold_1();
  pcStack_490 = (code *)0x183eae;
  puStack_1c0 = puVar1;
  uVar4 = uv_default_loop();
  pcStack_490 = (code *)0x183ec1;
  iVar3 = uv_tcp_init(uVar4,auStack_298);
  alStack_370[0] = (long)iVar3;
  auStack_3d8[0] = 0;
  if (alStack_370[0] == 0) {
    pcStack_490 = (code *)0x183f03;
    iVar3 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_450);
    alStack_370[0] = (long)iVar3;
    auStack_3d8[0] = 0;
    if (alStack_370[0] != 0) goto LAB_00184123;
    pcStack_490 = (code *)0x183f50;
    iVar3 = uv_tcp_connect(auStack_3d8,auStack_298,auStack_450,connect_4);
    alStack_370[0] = (long)iVar3;
    alStack_440[0] = 0;
    if (alStack_370[0] != 0) goto LAB_00184138;
    pcStack_490 = (code *)0x183f88;
    iVar3 = uv_interface_addresses(alStack_370,alStack_440);
    if (iVar3 != 0) {
LAB_00183f8c:
      pcStack_490 = (code *)0x183f96;
      iVar3 = uv_run(uVar4,0);
      lStack_480 = (long)iVar3;
      lStack_478 = 0;
      if (lStack_480 != 0) goto LAB_0018414a;
      pcStack_490 = (code *)0x183fc7;
      uv_walk(uVar4,close_walk_cb,0);
      pcStack_490 = (code *)0x183fd1;
      uv_run(uVar4,0);
      lStack_480 = 0;
      pcStack_490 = (code *)0x183fe2;
      iVar3 = uv_loop_close(uVar4);
      lStack_478 = (long)iVar3;
      if (lStack_480 == lStack_478) {
        pcStack_490 = (code *)0x183ffe;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00184159;
    }
    if ((long)(int)alStack_440[0] < 1) {
LAB_00184104:
      pcStack_490 = (code *)0x184109;
      uv_free_interface_addresses();
      goto LAB_00183f8c;
    }
    psVar5 = (short *)(alStack_370[0] + 0x14);
    uVar6 = 1;
    do {
      sVar2 = *psVar5;
      if (sVar2 == 10) break;
      psVar5 = psVar5 + 0x30;
      bVar8 = uVar6 < (ulong)(long)(int)alStack_440[0];
      uVar6 = uVar6 + 1;
    } while (bVar8);
    pcStack_490 = (code *)0x184047;
    uv_free_interface_addresses();
    if (sVar2 != 10) goto LAB_00183f8c;
    pcStack_490 = (code *)0x184061;
    iVar3 = uv_tcp_init(uVar4,alStack_370);
    alStack_440[0] = (long)iVar3;
    auStack_470[0] = 0;
    if (alStack_440[0] == 0) {
      pcStack_490 = (code *)0x184097;
      iVar3 = uv_ip6_addr("::",0x23a3,auStack_470);
      alStack_440[0] = (long)iVar3;
      lStack_480 = 0;
      if (alStack_440[0] != 0) goto LAB_00184177;
      pcStack_490 = (code *)0x1840d5;
      iVar3 = uv_tcp_connect(alStack_440,alStack_370,auStack_470,connect_6);
      lStack_480 = (long)iVar3;
      lStack_478 = 0;
      if (lStack_480 != 0) {
        pcStack_490 = (code *)0x184104;
        run_test_connect_unspecified_cold_6();
        goto LAB_00184104;
      }
      goto LAB_00183f8c;
    }
  }
  else {
    pcStack_490 = (code *)0x184123;
    run_test_connect_unspecified_cold_1();
LAB_00184123:
    pcStack_490 = (code *)0x184138;
    run_test_connect_unspecified_cold_2();
LAB_00184138:
    pcStack_490 = (code *)0x18414a;
    run_test_connect_unspecified_cold_3();
LAB_0018414a:
    pcStack_490 = (code *)0x184159;
    run_test_connect_unspecified_cold_7();
LAB_00184159:
    pcStack_490 = (code *)0x184168;
    run_test_connect_unspecified_cold_8();
  }
  pcStack_490 = (code *)0x184177;
  run_test_connect_unspecified_cold_4();
LAB_00184177:
  iVar3 = (int)&lStack_480;
  pcStack_490 = connect_4;
  run_test_connect_unspecified_cold_5();
  pcStack_490 = (code *)(long)iVar3;
  uStack_498 = 0xffffffffffffff9d;
  if (pcStack_490 != (code *)0xffffffffffffff9d) {
    return iVar3;
  }
  iVar3 = (int)&uStack_498;
  apcStack_4a8[0] = connect_6;
  connect_4_cold_1();
  apcStack_4a8[0] = (code *)(long)iVar3;
  if (apcStack_4a8[0] != (code *)0xffffffffffffff9d) {
    return iVar3;
  }
  ppcVar7 = apcStack_4a8;
  connect_6_cold_1();
  iVar3 = uv_is_closing();
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = uv_close(ppcVar7,0);
  return iVar3;
}

Assistant:

TEST_IMPL(condvar_4) {
  worker_config wc;
  uv_thread_t thread;

  /* Helper to signal-then-wait. */
  worker_config_init(&wc, 1, condvar_signal, condvar_timedwait);
  ASSERT_OK(uv_thread_create(&thread, worker, &wc));

  /* We wait-then-signal. */
  wc.wait_cond(&wc, &wc.posted_1);
  wc.signal_cond(&wc, &wc.posted_2);

  ASSERT_OK(uv_thread_join(&thread));
  worker_config_destroy(&wc);

  return 0;
}